

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O2

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_args::test_method
          (chainstatemanager_args *this)

{
  long lVar1;
  allocator_type *paVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  value_type *pvVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string file;
  const_string file_00;
  initializer_list<const_char_*> __l;
  const_string file_01;
  initializer_list<const_char_*> __l_00;
  const_string file_02;
  initializer_list<const_char_*> __l_01;
  const_string file_03;
  initializer_list<const_char_*> __l_02;
  const_string file_04;
  initializer_list<const_char_*> __l_03;
  const_string file_05;
  initializer_list<const_char_*> __l_04;
  const_string file_06;
  initializer_list<const_char_*> __l_05;
  const_string file_07;
  const_string file_08;
  initializer_list<const_char_*> __l_06;
  const_string file_09;
  initializer_list<const_char_*> __l_07;
  const_string file_10;
  initializer_list<const_char_*> __l_08;
  const_string file_11;
  initializer_list<const_char_*> __l_09;
  const_string file_12;
  initializer_list<const_char_*> __l_10;
  const_string file_13;
  initializer_list<const_char_*> __l_11;
  string_view str;
  string_view str_00;
  check_type cVar7;
  optional<uint256> *__return_storage_ptr__;
  arith_uint256 *paVar6;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  allocator_type local_479;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  anon_class_8_1_5dbb9ce7 get_valid_opts;
  anon_class_8_1_8991fb9c get_opts;
  undefined1 local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  pointer local_1b8;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_1b0;
  undefined1 local_198 [60];
  value_type local_15c [36];
  value_type local_138 [112];
  __index_type local_c8;
  undefined1 local_c0 [32];
  bool local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string minimum_chainwork;
  string assume_valid;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  get_valid_opts.get_opts = &get_opts;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x329;
  file.m_begin = (iterator)&local_218;
  get_opts.this = this;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_228,msg);
  minimum_chainwork._M_dataplus._M_p = (pointer)0x0;
  minimum_chainwork._M_string_length = 0;
  minimum_chainwork.field_2._M_allocated_capacity = 0;
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork);
  assume_valid._M_dataplus._M_p._0_1_ = local_138[0x20] ^ 1;
  assume_valid._M_string_length._0_1_ = 0;
  assume_valid._M_string_length._1_7_ = 0;
  assume_valid.field_2._M_local_buf[0] = '\0';
  assume_valid.field_2._M_allocated_capacity._1_7_ = 0;
  local_c0._24_8_ = local_98;
  local_98._0_8_ = "!get_valid_opts({}).assumed_valid_block";
  local_98._8_8_ = "";
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_230 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&assume_valid,(lazy_ostream *)local_c0,1,0,WARN,_cVar7,
             (size_t)&local_238,0x329);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&assume_valid.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x32a;
  file_00.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_258,
             msg_00);
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_260 = "";
  minimum_chainwork._M_dataplus._M_p = "-assumevalid=";
  __l._M_len = 1;
  __l._M_array = (iterator)&minimum_chainwork;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid,__l,
             (allocator_type *)local_98);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid);
  pvVar5 = local_138;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (local_c0,&local_268,0x32a,1,2,pvVar5,
             "get_valid_opts({\"-assumevalid=\"}).assumed_valid_block",&uint256::ZERO,
             "uint256::ZERO");
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x32b;
  file_01.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_288,
             msg_01);
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_290 = "";
  minimum_chainwork._M_dataplus._M_p = "-assumevalid=0";
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&minimum_chainwork;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid,__l_00,
             (allocator_type *)local_98);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid);
  pvVar5 = local_138;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (local_c0,&local_298,0x32b,1,2,pvVar5,
             "get_valid_opts({\"-assumevalid=0\"}).assumed_valid_block",&uint256::ZERO,
             "uint256::ZERO");
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x32c;
  file_02.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8,
             msg_02);
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2c0 = "";
  minimum_chainwork._M_dataplus._M_p = "-noassumevalid";
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&minimum_chainwork;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid,__l_01,
             (allocator_type *)local_98);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid);
  pvVar5 = local_138;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (local_c0,&local_2c8,0x32c,1,2,pvVar5,
             "get_valid_opts({\"-noassumevalid\"}).assumed_valid_block",&uint256::ZERO,
             "uint256::ZERO");
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&assume_valid);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x32d;
  file_03.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2e8,
             msg_03);
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2f0 = "";
  local_98._0_8_ = "-assumevalid=0x12";
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_98;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork,__l_02,
             (allocator_type *)&local_1d8);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork);
  assume_valid.field_2._M_allocated_capacity._1_7_ = 0;
  assume_valid.field_2._8_8_ = 0;
  assume_valid._M_dataplus._M_p._1_7_ = 0;
  assume_valid._M_string_length._0_1_ = 0;
  assume_valid._M_string_length._1_7_ = 0;
  assume_valid.field_2._M_local_buf[0] = '\0';
  assume_valid._M_dataplus._M_p._0_1_ = 0x12;
  pvVar5 = local_138;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
            (local_c0,&local_2f8,0x32d,1,2,pvVar5,
             "get_valid_opts({\"-assumevalid=0x12\"}).assumed_valid_block",&assume_valid,
             "uint256{0x12}");
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&assume_valid,
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef",
             (allocator<char> *)local_198);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0x330;
  file_04.m_begin = (iterator)&local_308;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_318,
             msg_04);
  minimum_chainwork._M_string_length = minimum_chainwork._M_string_length & 0xffffffffffffff00;
  minimum_chainwork._M_dataplus._M_p = "<W\x1b";
  minimum_chainwork.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  minimum_chainwork.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_320 = "";
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "-assumevalid=",&assume_valid);
  local_1f8._0_8_ = local_98._0_8_;
  paVar2 = (allocator_type *)&local_1b0;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_1f8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8,__l_03,paVar2);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8);
  str._M_len._1_7_ = assume_valid._M_dataplus._M_p._1_7_;
  str._M_len._0_1_ = (byte)assume_valid._M_dataplus._M_p;
  __return_storage_ptr__ = (optional<uint256> *)local_c0;
  str._M_str = (char *)paVar2;
  detail::FromHex<uint256>
            (__return_storage_ptr__,
             (detail *)
             CONCAT71(assume_valid._M_string_length._1_7_,(undefined1)assume_valid._M_string_length)
             ,str);
  pvVar5 = local_138;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,std::optional<uint256>>
            (&minimum_chainwork,&local_328,0x330,1,2,pvVar5,
             "get_valid_opts({(\"-assumevalid=\" + assume_valid).c_str()}).assumed_valid_block",
             __return_storage_ptr__,"uint256::FromHex(assume_valid)");
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8);
  std::__cxx11::string::~string((string *)local_98);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar3;
  file_05.m_end = (iterator)0x332;
  file_05.m_begin = (iterator)&local_338;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_348,
             msg_05);
  local_1f8._0_8_ = "-assumevalid=xyz";
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_1f8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_98,__l_04,
             (allocator_type *)&local_1b0);
  test_method::anon_class_8_1_8991fb9c::operator()
            ((Result<kernel::ChainstateManagerOpts> *)local_198,&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  minimum_chainwork._M_dataplus._M_p._0_1_ = local_c8 != '\x01';
  minimum_chainwork._M_string_length = 0;
  minimum_chainwork.field_2._M_allocated_capacity = 0;
  local_1d8._M_dataplus._M_p = "!get_opts({\"-assumevalid=xyz\"})";
  local_1d8._M_string_length = 0xc74779;
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_350 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_c0._24_8_ = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&minimum_chainwork,(lazy_ostream *)local_c0,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_358,0x332);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&minimum_chainwork.field_2._M_allocated_capacity);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts> *)
                    local_198);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0x333;
  file_06.m_begin = (iterator)&local_368;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_378,
             msg_06);
  local_1f8._0_8_ = "-assumevalid=01234567890123456789012345678901234567890123456789012345678901234"
  ;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_1f8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_98,__l_05,
             (allocator_type *)&local_1b0);
  test_method::anon_class_8_1_8991fb9c::operator()
            ((Result<kernel::ChainstateManagerOpts> *)local_198,&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  minimum_chainwork._M_dataplus._M_p._0_1_ = local_c8 != '\x01';
  minimum_chainwork._M_string_length = 0;
  minimum_chainwork.field_2._M_allocated_capacity = 0;
  local_1d8._M_dataplus._M_p =
       "!get_opts({\"-assumevalid=01234567890123456789012345678901234567890123456789012345678901234\"})"
  ;
  local_1d8._M_string_length = 0xc74826;
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_380 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_c0._24_8_ = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&minimum_chainwork,(lazy_ostream *)local_c0,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_388,0x333);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&minimum_chainwork.field_2._M_allocated_capacity);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts> *)
                    local_198);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  file_07.m_end = (iterator)0x336;
  file_07.m_begin = (iterator)&local_398;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3a8,
             msg_07);
  local_98._0_8_ = (char *)0x0;
  local_98._8_8_ = (element_type *)0x0;
  local_88._M_allocated_capacity = 0;
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  minimum_chainwork._M_dataplus._M_p =
       (pointer)(CONCAT71(minimum_chainwork._M_dataplus._M_p._1_7_,local_15c[0x20]) ^ 1);
  minimum_chainwork._M_string_length = 0;
  minimum_chainwork.field_2._M_allocated_capacity = 0;
  local_1d8._M_dataplus._M_p = "!get_valid_opts({}).minimum_chain_work";
  local_1d8._M_string_length = 0xc7484d;
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3b0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_c0._24_8_ = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&minimum_chainwork,(lazy_ostream *)local_c0,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_3b8,0x336);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&minimum_chainwork.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0x337;
  file_08.m_begin = (iterator)&local_3c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3d8,
             msg_08);
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3e0 = "";
  local_1d8._M_dataplus._M_p = "-minimumchainwork=0";
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_1d8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_98,__l_06,
             (allocator_type *)local_1f8);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  minimum_chainwork.field_2._M_allocated_capacity = 0;
  minimum_chainwork.field_2._8_8_ = 0;
  minimum_chainwork._M_dataplus._M_p = (pointer)0x0;
  minimum_chainwork._M_string_length = 0;
  base_uint<256U>::base_uint((base_uint<256U> *)&minimum_chainwork);
  pvVar5 = local_15c;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<arith_uint256>,arith_uint256>
            (local_c0,&local_3e8,0x337,1,2,pvVar5,
             "get_valid_opts({\"-minimumchainwork=0\"}).minimum_chain_work",&minimum_chainwork,
             "arith_uint256()");
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar3;
  file_09.m_end = (iterator)0x338;
  file_09.m_begin = (iterator)&local_3f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_408,
             msg_09);
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_410 = "";
  local_1d8._M_dataplus._M_p = "-nominimumchainwork";
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&local_1d8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_98,__l_07,
             (allocator_type *)local_1f8);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  minimum_chainwork.field_2._M_allocated_capacity = 0;
  minimum_chainwork.field_2._8_8_ = 0;
  minimum_chainwork._M_dataplus._M_p = (pointer)0x0;
  minimum_chainwork._M_string_length = 0;
  base_uint<256U>::base_uint((base_uint<256U> *)&minimum_chainwork);
  pvVar5 = local_15c;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<arith_uint256>,arith_uint256>
            (local_c0,&local_418,0x338,1,2,pvVar5,
             "get_valid_opts({\"-nominimumchainwork\"}).minimum_chain_work",&minimum_chainwork,
             "arith_uint256()");
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar3;
  file_10.m_end = (iterator)0x339;
  file_10.m_begin = (iterator)&local_428;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_438,
             msg_10);
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_440 = "";
  local_1d8._M_dataplus._M_p = "-minimumchainwork=0x1234";
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&local_1d8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_98,__l_08,
             (allocator_type *)local_1f8);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  base_uint<256U>::base_uint((base_uint<256U> *)&minimum_chainwork,0x1234);
  pvVar5 = local_15c;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<arith_uint256>,arith_uint256>
            (local_c0,&local_448,0x339,1,2,pvVar5,
             "get_valid_opts({\"-minimumchainwork=0x1234\"}).minimum_chain_work",&minimum_chainwork,
             "arith_uint256{0x1234}");
  std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&minimum_chainwork,
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef",
             (allocator<char> *)local_198);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar3;
  file_11.m_end = (iterator)0x33c;
  file_11.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_468,
             msg_11);
  local_98._8_8_ = local_98._8_8_ & 0xffffffffffffff00;
  local_98._0_8_ = &PTR__lazy_ostream_01139f30;
  local_88._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_88._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_470 = "";
  std::operator+(&local_1d8,"-minimumchainwork=",&minimum_chainwork);
  local_1b8 = (pointer)local_1d8._M_dataplus._M_p;
  paVar2 = &local_479;
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)&local_1b8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1b0,__l_09,paVar2);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_198,&get_valid_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1b0);
  str_00._M_str = (char *)paVar2;
  str_00._M_len = (size_t)minimum_chainwork._M_dataplus._M_p;
  detail::FromHex<uint256>
            ((optional<uint256> *)local_c0,(detail *)minimum_chainwork._M_string_length,str_00);
  if (local_a0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    UintToArith256((arith_uint256 *)local_1f8,(uint256 *)local_c0);
    pvVar5 = local_15c;
    pvVar3 = (iterator)0x2;
    paVar6 = (arith_uint256 *)local_1f8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<arith_uint256>,arith_uint256>
              (local_98,&local_478,0x33c,1,2,pvVar5,
               "get_valid_opts({(\"-minimumchainwork=\" + minimum_chainwork).c_str()}).minimum_chain_work"
               ,(arith_uint256 *)local_1f8,
               "UintToArith256(uint256::FromHex(minimum_chainwork).value())");
    std::filesystem::__cxx11::path::~path((path *)(local_198 + 8));
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d8);
    local_490 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_488 = "";
    local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_498 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = pvVar5;
    msg_12.m_begin = pvVar3;
    file_12.m_end = (iterator)0x33e;
    file_12.m_begin = (iterator)&local_490;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4a0,
               msg_12);
    local_1b0._M_impl.super__Vector_impl_data._M_start = (pointer)0xc74a12;
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)&local_1b0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8,__l_10,
               (allocator_type *)&local_1b8);
    test_method::anon_class_8_1_8991fb9c::operator()
              ((Result<kernel::ChainstateManagerOpts> *)local_198,&get_opts,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8);
    local_98._8_8_ = (element_type *)0x0;
    local_88._M_allocated_capacity = 0;
    local_1f8._0_8_ = "!get_opts({\"-minimumchainwork=xyz\"})";
    local_1f8._8_8_ = "";
    local_c0[8] = false;
    local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
    local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_4b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_4a8 = "";
    pvVar3 = &DAT_00000001;
    pvVar4 = (iterator)0x0;
    local_c0._24_8_ = (arith_uint256 *)local_1f8;
    local_98[0] = (class_property<bool>)(class_property<bool>)(local_c8 != '\x01');
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,(lazy_ostream *)local_c0,1,0,WARN,(check_type)paVar6,
               (size_t)&local_4b0,0x33e);
    boost::detail::shared_count::~shared_count((shared_count *)&local_88._M_allocated_capacity);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts>
    ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts> *)
                        local_198);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8);
    local_4c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_4b8 = "";
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar4;
    msg_13.m_begin = pvVar3;
    file_13.m_end = (iterator)0x33f;
    file_13.m_begin = (iterator)&local_4c0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4d0,
               msg_13);
    local_1b0._M_impl.super__Vector_impl_data._M_start = (pointer)0xc74a4d;
    __l_11._M_len = 1;
    __l_11._M_array = (iterator)&local_1b0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8,__l_11,
               (allocator_type *)&local_1b8);
    test_method::anon_class_8_1_8991fb9c::operator()
              ((Result<kernel::ChainstateManagerOpts> *)local_198,&get_opts,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8);
    local_98[0] = (class_property<bool>)(class_property<bool>)(local_c8 != '\x01');
    local_98._8_8_ = (element_type *)0x0;
    local_88._M_allocated_capacity = 0;
    local_1f8._0_8_ =
         "!get_opts({\"-minimumchainwork=01234567890123456789012345678901234567890123456789012345678901234\"})"
    ;
    local_1f8._8_8_ = "";
    local_c0[8] = false;
    local_c0._0_8_ = &PTR__lazy_ostream_0113a070;
    local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_4e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_4d8 = "";
    local_c0._24_8_ = (arith_uint256 *)local_1f8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,(lazy_ostream *)local_c0,1,0,WARN,(check_type)paVar6,
               (size_t)&local_4e0,0x33f);
    boost::detail::shared_count::~shared_count((shared_count *)&local_88._M_allocated_capacity);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts>
    ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts> *)
                        local_198);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8);
    std::__cxx11::string::~string((string *)&minimum_chainwork);
    std::__cxx11::string::~string((string *)&assume_valid);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_args, BasicTestingSetup)
{
    //! Try to apply the provided args to a ChainstateManager::Options
    auto get_opts = [&](const std::vector<const char*>& args) {
        static kernel::Notifications notifications{};
        static const ChainstateManager::Options options{
            .chainparams = ::Params(),
            .datadir = {},
            .notifications = notifications};
        return SetOptsFromArgs(*this->m_node.args, options, args);
    };
    //! Like get_opts, but requires the provided args to be valid and unwraps the result
    auto get_valid_opts = [&](const std::vector<const char*>& args) {
        const auto result{get_opts(args)};
        BOOST_REQUIRE_MESSAGE(result, util::ErrorString(result).original);
        return *result;
    };

    // test -assumevalid
    BOOST_CHECK(!get_valid_opts({}).assumed_valid_block);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid="}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid=0"}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-noassumevalid"}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid=0x12"}).assumed_valid_block, uint256{0x12});

    std::string assume_valid{"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"};
    BOOST_CHECK_EQUAL(get_valid_opts({("-assumevalid=" + assume_valid).c_str()}).assumed_valid_block, uint256::FromHex(assume_valid));

    BOOST_CHECK(!get_opts({"-assumevalid=xyz"}));                                                               // invalid hex characters
    BOOST_CHECK(!get_opts({"-assumevalid=01234567890123456789012345678901234567890123456789012345678901234"})); // > 64 hex chars

    // test -minimumchainwork
    BOOST_CHECK(!get_valid_opts({}).minimum_chain_work);
    BOOST_CHECK_EQUAL(get_valid_opts({"-minimumchainwork=0"}).minimum_chain_work, arith_uint256());
    BOOST_CHECK_EQUAL(get_valid_opts({"-nominimumchainwork"}).minimum_chain_work, arith_uint256());
    BOOST_CHECK_EQUAL(get_valid_opts({"-minimumchainwork=0x1234"}).minimum_chain_work, arith_uint256{0x1234});

    std::string minimum_chainwork{"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"};
    BOOST_CHECK_EQUAL(get_valid_opts({("-minimumchainwork=" + minimum_chainwork).c_str()}).minimum_chain_work, UintToArith256(uint256::FromHex(minimum_chainwork).value()));

    BOOST_CHECK(!get_opts({"-minimumchainwork=xyz"}));                                                               // invalid hex characters
    BOOST_CHECK(!get_opts({"-minimumchainwork=01234567890123456789012345678901234567890123456789012345678901234"})); // > 64 hex chars
}